

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ScatterAlongAxisLayerParams::SharedCtor(ScatterAlongAxisLayerParams *this)

{
  ScatterAlongAxisLayerParams *this_local;
  
  memset(&this->axis_,0,0xc);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ScatterAlongAxisLayerParams::SharedCtor() {
  ::memset(&axis_, 0, reinterpret_cast<char*>(&mode_) -
    reinterpret_cast<char*>(&axis_) + sizeof(mode_));
  _cached_size_ = 0;
}